

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::Optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
reset(Optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  pointer pcVar2;
  
  pbVar1 = this->nullableValue;
  if (pbVar1 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    pcVar2 = (pbVar1->_M_dataplus)._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != &pbVar1->field_2) {
      operator_delete(pcVar2,(pbVar1->field_2)._M_allocated_capacity + 1);
    }
  }
  this->nullableValue = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  return;
}

Assistant:

void reset() {
            if ( nullableValue ) { nullableValue->~T(); }
            nullableValue = nullptr;
        }